

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var __thiscall
Js::JavascriptPromise::ResolveHelper
          (JavascriptPromise *this,Var resolution,bool isRejecting,ScriptContext *scriptContext)

{
  code *pcVar1;
  RecyclableObject *thenable_00;
  bool bVar2;
  RecyclableObject *thenFunction;
  JavascriptLibrary *pJVar3;
  undefined4 *puVar4;
  Var pvVar5;
  nullptr_t local_90;
  JavascriptPromiseReactionList *local_88;
  JavascriptPromiseReactionList *reactions;
  PromiseStatus newStatus;
  JavascriptException *err;
  JavascriptPromiseResolveThenableTaskFunction *resolveThenableTaskFunction;
  Var then;
  RecyclableObject *local_50;
  RecyclableObject *thenable;
  JavascriptError *selfResolutionError;
  Var undefinedVar;
  JavascriptLibrary *library;
  ScriptContext *scriptContext_local;
  RecyclableObject *pRStack_20;
  bool isRejecting_local;
  Var resolution_local;
  JavascriptPromise *this_local;
  
  library = (JavascriptLibrary *)scriptContext;
  scriptContext_local._7_1_ = isRejecting;
  pRStack_20 = (RecyclableObject *)resolution;
  resolution_local = this;
  undefinedVar = ScriptContext::GetLibrary(scriptContext);
  selfResolutionError =
       (JavascriptError *)JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)undefinedVar)
  ;
  if ((scriptContext_local._7_1_ & 1) == 0) {
    bVar2 = JavascriptConversion::SameValue(pRStack_20,this);
    if (bVar2) {
      pJVar3 = ScriptContext::GetLibrary((ScriptContext *)library);
      thenable = (RecyclableObject *)JavascriptLibrary::CreateTypeError(pJVar3);
      JavascriptError::SetErrorMessage
                ((JavascriptError *)thenable,-0x7ff5ea13,L"",(ScriptContext *)library);
      pRStack_20 = thenable;
      scriptContext_local._7_1_ = 1;
    }
    else {
      bVar2 = VarIs<Js::RecyclableObject>(pRStack_20);
      if (bVar2) {
        local_50 = VarTo<Js::RecyclableObject>(pRStack_20);
        resolveThenableTaskFunction =
             (JavascriptPromiseResolveThenableTaskFunction *)
             Js::JavascriptOperators::GetPropertyNoCache(local_50,0x169,(ScriptContext *)library);
        bVar2 = JavascriptConversion::IsCallable(resolveThenableTaskFunction);
        pvVar5 = undefinedVar;
        thenable_00 = local_50;
        if (bVar2) {
          thenFunction = VarTo<Js::RecyclableObject>(resolveThenableTaskFunction);
          err = (JavascriptException *)
                JavascriptLibrary::CreatePromiseResolveThenableTaskFunction
                          ((JavascriptLibrary *)pvVar5,EntryResolveThenableTaskFunction,this,
                           thenable_00,thenFunction);
          JavascriptLibrary::EnqueueTask((JavascriptLibrary *)undefinedVar,err);
          return selfResolutionError;
        }
      }
    }
  }
  if ((scriptContext_local._7_1_ & 1) == 0) {
    reactions._7_1_ = PromiseStatusCode_HasResolution;
  }
  else {
    reactions._7_1_ = PromiseStatusCode_HasRejection;
    bVar2 = GetIsHandled(this);
    if (!bVar2) {
      pJVar3 = ScriptContext::GetLibrary((ScriptContext *)library);
      JavascriptLibrary::CallNativeHostPromiseRejectionTracker(pJVar3,this,pRStack_20,false);
    }
  }
  if (pRStack_20 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x49d,"(resolution != nullptr)","resolution != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_88 = GetReactions(this);
  if (local_88 != (JavascriptPromiseReactionList *)0x0) {
    SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Reverse
              (&local_88->
                super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>);
  }
  Memory::WriteBarrierPtr<void>::operator=(&this->result,pRStack_20);
  local_90 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>::
  operator=(&this->reactions,&local_90);
  SetStatus(this,reactions._7_1_);
  pvVar5 = TriggerPromiseReactions
                     (local_88,(bool)(scriptContext_local._7_1_ & 1),pRStack_20,
                      (ScriptContext *)library);
  return pvVar5;
}

Assistant:

Var JavascriptPromise::ResolveHelper(Var resolution, bool isRejecting, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        Var undefinedVar = library->GetUndefined();

        // We only need to check SameValue and check for thenable resolution in the Resolve function case (not Reject)
        if (!isRejecting)
        {
            if (JavascriptConversion::SameValue(resolution, this))
            {
                JavascriptError* selfResolutionError = scriptContext->GetLibrary()->CreateTypeError();
                JavascriptError::SetErrorMessage(selfResolutionError, JSERR_PromiseSelfResolution, _u(""), scriptContext);

                resolution = selfResolutionError;
                isRejecting = true;
            }
            else if (VarIs<RecyclableObject>(resolution))
            {
                try
                {
                    RecyclableObject* thenable = VarTo<RecyclableObject>(resolution);
                    Var then = JavascriptOperators::GetPropertyNoCache(thenable, Js::PropertyIds::then, scriptContext);

                    if (JavascriptConversion::IsCallable(then))
                    {
                        JavascriptPromiseResolveThenableTaskFunction* resolveThenableTaskFunction = library->CreatePromiseResolveThenableTaskFunction(EntryResolveThenableTaskFunction, this, thenable, VarTo<RecyclableObject>(then));

                        library->EnqueueTask(resolveThenableTaskFunction);

                        return undefinedVar;
                    }
                }
                catch (const JavascriptException& err)
                {
                    resolution = err.GetAndClear()->GetThrownObject(scriptContext);

                    if (resolution == nullptr)
                    {
                        resolution = undefinedVar;
                    }

                    isRejecting = true;
                }
            }
        }


        PromiseStatus newStatus;

        // Need to check rejecting state again as it might have changed due to failures
        if (isRejecting)
        {
            newStatus = PromiseStatusCode_HasRejection;
            if (!GetIsHandled())
            {
                scriptContext->GetLibrary()->CallNativeHostPromiseRejectionTracker(this, resolution, false);
            }
        }
        else
        {
            newStatus = PromiseStatusCode_HasResolution;
        }

        Assert(resolution != nullptr);

        // SList only supports "prepend" operation, so we need to reverse the list
        // before triggering reactions
        JavascriptPromiseReactionList* reactions = this->GetReactions();
        if (reactions != nullptr)
        {
            reactions->Reverse();
        }

        this->result = resolution;
        this->reactions = nullptr;
        this->SetStatus(newStatus);

        return TriggerPromiseReactions(reactions, isRejecting, resolution, scriptContext);
    }